

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeStack.h
# Opt level: O0

BOOL __thiscall LargeStack<Js::StringCopyInfo>::Empty(LargeStack<Js::StringCopyInfo> *this)

{
  bool bVar1;
  BOOL BVar2;
  Type *ppLVar3;
  LargeStackBlock<Js::StringCopyInfo> *top;
  LargeStack<Js::StringCopyInfo> *this_local;
  
  ppLVar3 = SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::Top
                      (this->blockStack);
  BVar2 = LargeStackBlock<Js::StringCopyInfo>::Empty(*ppLVar3);
  if (BVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::
            HasOne(&this->blockStack->
                    super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                  );
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::Pop
                (this->blockStack);
      bVar1 = SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::
              Empty(&this->blockStack->
                     super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                   );
      this_local._4_4_ = (uint)bVar1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL Empty() {
        LargeStackBlock<T>* top=blockStack->Top();
        if (top->Empty()) {
            if (blockStack->HasOne()) {
                // Avoid popping the last empty block to reduce freelist overhead.
                return true;
            }

            blockStack->Pop();
            return blockStack->Empty();
        }
        else return false;
    }